

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O3

void TemplateCacheUnittest::TestReloadImmediateWithDifferentSearchPaths(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  int iVar5;
  Template *pTVar6;
  string *this;
  bool bVar7;
  string path_a_foo;
  string path_b_foo;
  string pathB;
  string pathA;
  TemplateCache cache1;
  TemplateDictionary dict;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  TemplateString local_e0 [2];
  TemplateDictionary local_a0 [112];
  
  local_e0[0].ptr_ = "empty";
  local_e0[0].length_ = 5;
  local_e0[0].is_immutable_ = true;
  local_e0[0].id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary(local_a0,local_e0,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_e0);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"a/","");
  ctemplate::PathJoin((string *)&local_100,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  paVar1 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"b/","");
  ctemplate::PathJoin((string *)&local_140,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  ctemplate::CreateOrCleanTestDir(&local_100);
  ctemplate::CreateOrCleanTestDir(&local_140);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_e0);
  ctemplate::TemplateCache::AddAlternateTemplateRootDirectory((string *)local_e0);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var3._M_p = local_160._M_dataplus._M_p;
  if (local_160._M_string_length == local_100._M_string_length) {
    if (local_160._M_string_length == 0) {
      bVar7 = true;
    }
    else {
      iVar5 = bcmp(local_160._M_dataplus._M_p,local_100._M_dataplus._M_p,local_160._M_string_length)
      ;
      bVar7 = iVar5 == 0;
    }
  }
  else {
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p);
  }
  if (bVar7) {
    paVar1 = &local_180.field_2;
    local_180._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"template_foo","");
    ctemplate::PathJoin((string *)&local_160,(string *)&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar1) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    local_180._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"b/template_foo","");
    ctemplate::StringToFile(&local_180,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar1) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    _Var4._M_p = local_160._M_dataplus._M_p;
    paVar2 = &local_1a0.field_2;
    local_1a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"template_foo","");
    ctemplate::TemplateCache::FindTemplateFilename((string *)&local_180);
    _Var3._M_p = local_180._M_dataplus._M_p;
    iVar5 = strcmp(_Var4._M_p,local_180._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if (iVar5 == 0) {
      local_180._M_dataplus._M_p = "template_foo";
      local_180._M_string_length = 0xc;
      local_180.field_2._M_local_buf[0] = '\x01';
      local_180.field_2._8_8_ = 0;
      ctemplate::TemplateCache::GetTemplate(local_e0,(Strip)&local_180);
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"template_foo","");
      ctemplate::PathJoin((string *)&local_180,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"a/template_foo","");
      ctemplate::StringToFile(&local_1a0,&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      _Var4._M_p = local_180._M_dataplus._M_p;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"template_foo","");
      ctemplate::TemplateCache::FindTemplateFilename((string *)&local_1a0);
      _Var3._M_p = local_1a0._M_dataplus._M_p;
      iVar5 = strcmp(_Var4._M_p,local_1a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p != paVar2) {
        operator_delete(_Var3._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if (iVar5 == 0) {
        ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)local_e0);
        local_1a0._M_dataplus._M_p = "template_foo";
        local_1a0._M_string_length = 0xc;
        local_1a0.field_2._M_local_buf[0] = '\x01';
        local_1a0.field_2._8_8_ = 0;
        pTVar6 = (Template *)ctemplate::TemplateCache::GetTemplate(local_e0,(Strip)&local_1a0);
        local_1a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"a/template_foo","");
        ctemplate::AssertExpandIs(pTVar6,local_a0,&local_1a0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        unlink(local_180._M_dataplus._M_p);
        ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)local_e0);
        local_1a0._M_dataplus._M_p = "template_foo";
        local_1a0._M_string_length = 0xc;
        local_1a0.field_2._M_local_buf[0] = '\x01';
        local_1a0.field_2._8_8_ = 0;
        pTVar6 = (Template *)ctemplate::TemplateCache::GetTemplate(local_e0,(Strip)&local_1a0);
        local_1a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"b/template_foo","");
        ctemplate::AssertExpandIs(pTVar6,local_a0,&local_1a0,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_e0);
        ctemplate::TemplateDictionary::~TemplateDictionary(local_a0);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x212,
             "strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
            );
      _Var3._M_p = local_180._M_dataplus._M_p;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"template_foo","");
      ctemplate::TemplateCache::FindTemplateFilename((string *)&local_1a0);
      iVar5 = strcmp(_Var3._M_p,local_1a0._M_dataplus._M_p);
      if (iVar5 != 0) {
        __assert_fail("strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x212,
                      "static void TemplateCacheUnittest::TestReloadImmediateWithDifferentSearchPaths()"
                     );
      }
      std::__cxx11::string::~string((string *)&local_1a0);
      this = &local_120;
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x20a,
             "strcmp(path_b_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
            );
      _Var3._M_p = local_160._M_dataplus._M_p;
      local_1a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"template_foo","");
      ctemplate::TemplateCache::FindTemplateFilename((string *)&local_180);
      iVar5 = strcmp(_Var3._M_p,local_180._M_dataplus._M_p);
      if (iVar5 != 0) {
        __assert_fail("strcmp(path_b_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x20a,
                      "static void TemplateCacheUnittest::TestReloadImmediateWithDifferentSearchPaths()"
                     );
      }
      std::__cxx11::string::~string((string *)&local_180);
      this = &local_1a0;
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x204,"cache1.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    if (local_160._M_string_length != local_100._M_string_length) {
LAB_0010c669:
      __assert_fail("cache1.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x204,
                    "static void TemplateCacheUnittest::TestReloadImmediateWithDifferentSearchPaths()"
                   );
    }
    if (local_160._M_string_length != 0) {
      iVar5 = bcmp(local_160._M_dataplus._M_p,local_100._M_dataplus._M_p,local_160._M_string_length)
      ;
      if (iVar5 != 0) goto LAB_0010c669;
    }
    this = &local_160;
  }
  std::__cxx11::string::~string((string *)this);
  exit(1);
}

Assistant:

static void TestStringToTemplateCacheWithStrip() {
    const string cache_key_a = "cache key a";
    const string text = "Test template 1";
    TemplateDictionary empty_dict("dict");

    TemplateCache cache;
    ASSERT(cache.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP));

    TemplateCachePeer cache_peer(&cache);
    TemplateCachePeer::TemplateCacheKey cache_key1(cache_key_a, DO_NOT_STRIP);
    ASSERT(cache_peer.TemplateIsCached(cache_key1));
    const Template* tpl1 = cache_peer.GetTemplate(cache_key_a, DO_NOT_STRIP);
    ASSERT(tpl1);
    AssertExpandIs(tpl1, &empty_dict, text, true);

    // Different strip: when a string template is registered via
    // StringToTemplateCache with a strip, we cannot use a different
    // strip later to fetch the template.
    TemplateCachePeer::TemplateCacheKey cache_key2(cache_key_a,
                                                   STRIP_WHITESPACE);
    ASSERT(!cache_peer.TemplateIsCached(cache_key2));
  }